

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O3

CSharedMemoryObject *
CorUnix::InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
          (CObjectType *arg1,_CRITICAL_SECTION *arg2)

{
  CSharedMemoryObject *pCVar1;
  
  pCVar1 = (CSharedMemoryObject *)InternalMalloc(0x1c8);
  if (pCVar1 != (CSharedMemoryObject *)0x0) {
    (pCVar1->super_CPalObjectBase).m_lRefCount = 1;
    (pCVar1->super_CPalObjectBase).m_pvImmutableData = (VOID *)0x0;
    (pCVar1->super_CPalObjectBase).m_pvLocalData = (VOID *)0x0;
    (pCVar1->super_CPalObjectBase).m_pot = arg1;
    (pCVar1->super_CPalObjectBase).m_oa.sObjectName.m_pwsz = (WCHAR *)0x0;
    (pCVar1->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength = 0;
    (pCVar1->super_CPalObjectBase).m_oa.sObjectName.m_dwMaxLength = 0;
    (pCVar1->super_CPalObjectBase).m_oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
    (pCVar1->super_CPalObjectBase).m_sdlLocalData.super_IDataLock._vptr_IDataLock =
         (_func_int **)&PTR_ReleaseLock_014c2bf0;
    (pCVar1->super_CPalObjectBase).m_sdlLocalData.m_fInitialized = false;
    (pCVar1->super_CPalObjectBase).m_pthrCleanup = (CPalThread *)0x0;
    (pCVar1->super_CPalObjectBase).super_IPalObject._vptr_IPalObject =
         (_func_int **)&PTR_GetObjectType_014c2c50;
    pCVar1->m_pcsObjListLock = arg2;
    pCVar1->m_shmod = 0;
    pCVar1->m_pvSharedData = (VOID *)0x0;
    (pCVar1->m_ssmlSharedData).super_IDataLock._vptr_IDataLock =
         (_func_int **)&PTR_ReleaseLock_014c2e48;
    (pCVar1->m_sdlSharedData).super_IDataLock._vptr_IDataLock =
         (_func_int **)&PTR_ReleaseLock_014c2bf0;
    (pCVar1->m_sdlSharedData).m_fInitialized = false;
    pCVar1->m_ObjectDomain = ProcessLocalObject;
    pCVar1->m_fSharedDataDereferenced = 0;
    pCVar1->m_fDeleteSharedData = 0;
    (pCVar1->m_le).Blink = &pCVar1->m_le;
    (pCVar1->m_le).Flink = &pCVar1->m_le;
  }
  return pCVar1;
}

Assistant:

T* InternalNew(A1 arg1, A2 arg2)
    {
        INTERNAL_NEW_COMMON();
        return new (pMem) T(arg1, arg2);
    }